

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTcSymEnum::gen_code(CTcSymEnum *this,int discard)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  
  if (discard != 0) {
    return;
  }
  CTcGenTarg::write_op(G_cg,'\x0f');
  CTcDataStream::write_enum_id(&G_cs->super_CTcDataStream,(this->super_CTcSymEnumBase).enum_id_);
  pCVar3 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar3->max_sp_depth_ <= iVar2) {
    pCVar3->max_sp_depth_ = iVar1;
  }
  return;
}

Assistant:

void CTcSymEnum::gen_code(int discard)
{
    if (!discard)
    {
        /* generate code to push the enum value */
        G_cg->write_op(OPC_PUSHENUM);
        G_cs->write_enum_id(get_enum_id());

        /* note the push */
        G_cg->note_push();
    }
}